

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int VmProcessLongOpt(jx9_value *pKey,jx9_value *pValue,void *pUserData)

{
  char *pB1;
  char *pcVar1;
  sxi32 sVar2;
  char *zName;
  long lVar3;
  ushort **ppuVar4;
  char *pcVar5;
  char *zArg;
  sxu32 nSize;
  char *pcVar6;
  int nByte;
  int local_4c;
  int local_34;
  
  if ((pValue->iFlags & 1) != 0) {
    zName = jx9_value_to_string(pValue,&local_34);
    lVar3 = (long)local_34;
    if (0 < lVar3) {
      if (zName[lVar3 + -1] == ':') {
        pcVar6 = zName + lVar3 + -1;
        if (zName <= pcVar6) {
          pcVar1 = zName + lVar3 + -2;
          do {
            pcVar6 = pcVar1;
            if (pcVar6 < zName) break;
            pcVar1 = pcVar6 + -1;
          } while (*pcVar6 == ':');
        }
        if (pcVar6 <= zName) {
          return 0;
        }
        pcVar6[1] = '\0';
        local_34 = (int)pcVar6 + 1;
        local_4c = 1;
      }
      else {
        local_34 = (int)zName + local_34;
        local_4c = 0;
      }
      pcVar6 = *pUserData;
      pcVar1 = *(char **)((long)pUserData + 8);
      if (pcVar6 < pcVar1) {
        nSize = local_34 - (int)zName;
        do {
          if (((*pcVar6 == '-') && (pcVar6 + 1 < pcVar1)) && (pcVar6[1] == '-')) {
            pB1 = pcVar6 + 2;
            zArg = pB1;
            if (pB1 < pcVar1) {
              ppuVar4 = __ctype_b_loc();
              pcVar5 = pcVar1 + (-2 - (long)pcVar6);
              pcVar6 = pB1;
              do {
                zArg = pcVar6;
                if (((long)*pcVar6 == 0x3d) || (((*ppuVar4)[*pcVar6] & 0x2000) != 0)) break;
                pcVar6 = pcVar6 + 1;
                pcVar5 = pcVar5 + -1;
                zArg = pcVar1;
              } while (pcVar5 != (char *)0x0);
            }
            pcVar6 = zArg;
            if (((int)zArg - (int)pB1 == nSize) && (sVar2 = SyMemcmp(pB1,zName,nSize), sVar2 == 0))
            {
              if (zArg == (char *)0x0) {
                return 0;
              }
              VmExtractOptArgValue
                        (*(jx9_value **)((long)pUserData + 0x18),
                         *(jx9_value **)((long)pUserData + 0x10),zArg,pcVar1,local_4c,
                         *(jx9_context **)((long)pUserData + 0x20),zName);
              return 0;
            }
          }
          else {
            pcVar6 = pcVar6 + 1;
          }
        } while (pcVar6 < pcVar1);
      }
    }
  }
  return 0;
}

Assistant:

static int VmProcessLongOpt(jx9_value *pKey, jx9_value *pValue, void *pUserData)
{
	struct getopt_long_opt *pOpt = (struct getopt_long_opt *)pUserData;
	const char *zArg, *zOpt, *zEnd;
	int need_value = 0;
	int nByte;
	/* Value must be of type string */
	if( !jx9_value_is_string(pValue) ){
		/* Simply ignore */
		return JX9_OK;
	}
	zOpt = jx9_value_to_string(pValue, &nByte);
	if( nByte < 1 ){
		/* Empty string, ignore */
		return JX9_OK;
	}
	zEnd = &zOpt[nByte - 1];
	if( zEnd[0] == ':' ){
		char *zTerm;
		/* Try to extract a value */
		need_value = 1;
		while( zEnd >= zOpt && zEnd[0] == ':' ){
			zEnd--;
		}
		if( zOpt >= zEnd ){
			/* Empty string, ignore */
			SXUNUSED(pKey);
			return JX9_OK;
		}
		zEnd++;
		zTerm = (char *)zEnd;
		zTerm[0] = 0;
	}else{
		zEnd = &zOpt[nByte];
	}
	/* Find the option */
	zArg = VmFindLongOpt(zOpt, (int)(zEnd-zOpt), pOpt->zArgIn, pOpt->zArgEnd);
	if( zArg == 0 ){
		/* No such option, return immediately */
		return JX9_OK;
	}
	/* Try to extract a value */
	VmExtractOptArgValue(pOpt->pArray, pOpt->pWorker, zArg, pOpt->zArgEnd, need_value, pOpt->pCtx, zOpt);
	return JX9_OK;
}